

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O0

word zzAddMulW(word *b,word *a,size_t n,word w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  size_t i;
  dword prod;
  word carry;
  word w_local;
  size_t n_local;
  word *a_local;
  word *b_local;
  
  carry = 0;
  for (i = 0; i < n; i = i + 1) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = w;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = a[i];
    uVar3 = SUB168(auVar1 * auVar2,0);
    uVar4 = uVar3 + carry;
    carry = SUB168(auVar1 * auVar2,8) + (ulong)CARRY8(uVar3,carry) + (ulong)CARRY8(uVar4,b[i]);
    b[i] = uVar4 + b[i];
  }
  return carry;
}

Assistant:

word zzAddMulW(word b[], const word a[], size_t n, register word w)
{
	register word carry = 0;
	register dword prod;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
		zzMul11(prod, w, a[i]);
		prod += carry;
		prod += b[i];
		b[i] = (word)prod;
		carry = (word)(prod >> B_PER_W);
	}
	prod = 0, w = 0;
	return carry;
}